

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-capnp.c++
# Opt level: O0

StringTree * __thiscall
capnp::anon_unknown_1::CapnpcCapnpMain::genParamList
          (StringTree *__return_storage_ptr__,CapnpcCapnpMain *this,InterfaceSchema interface,
          StructSchema schema,Reader brand,Method method)

{
  Reader RVar1;
  uint64_t uVar2;
  char (*in_R8) [2];
  Maybe<capnp::InterfaceSchema::Method> local_1d0;
  SegmentReader *local_188;
  CapTableReader *pCStack_180;
  void *local_178;
  WirePointer *pWStack_170;
  undefined8 local_168;
  int iStack_160;
  undefined4 uStack_15c;
  Schema local_158;
  Schema local_150;
  ArrayPtr<const_char> local_138;
  anon_class_16_2_836101a6 local_128;
  FieldList local_118;
  Mapper<capnp::StructSchema::FieldList> local_e0;
  Array<kj::StringTree> local_a8;
  StringTree local_90;
  Reader local_58;
  CapnpcCapnpMain *local_28;
  CapnpcCapnpMain *this_local;
  StructSchema schema_local;
  InterfaceSchema interface_local;
  
  RVar1._reader = brand._reader;
  local_28 = this;
  this_local = (CapnpcCapnpMain *)schema.super_Schema.raw;
  schema_local.super_Schema.raw = interface.super_Schema.raw;
  Schema::getProto(&local_58,(Schema *)&this_local);
  uVar2 = capnp::schema::Node::Reader::getScopeId(&local_58);
  if (uVar2 == 0) {
    StructSchema::getFields(&local_118,(StructSchema *)&this_local);
    kj::_::Mapper<capnp::StructSchema::FieldList>::Mapper(&local_e0,&local_118);
    local_128.interface = (InterfaceSchema *)&schema_local;
    local_128.this = this;
    kj::_::Mapper<capnp::StructSchema::FieldList>::
    operator*<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnpc_capnp_c__:499:11)>
              (&local_a8,&local_e0,&local_128);
    kj::StringPtr::StringPtr((StringPtr *)&local_138,", ");
    kj::StringTree::StringTree(&local_90,&local_a8,(StringPtr)local_138);
    kj::strTree<char_const(&)[2],kj::StringTree,char_const(&)[2]>
              (__return_storage_ptr__,(kj *)0x281089,(char (*) [2])&local_90,(StringTree *)0x28e38c,
               in_R8);
    kj::StringTree::~StringTree(&local_90);
    kj::Array<kj::StringTree>::~Array(&local_a8);
  }
  else {
    local_150.raw = (RawBrandedSchema *)this_local;
    local_158 = schema_local.super_Schema.raw;
    local_188 = brand._reader.segment;
    pCStack_180 = brand._reader.capTable;
    local_178 = brand._reader.data;
    pWStack_170 = brand._reader.pointers;
    local_168._0_4_ = brand._reader.dataSize;
    local_168._4_2_ = brand._reader.pointerCount;
    local_168._6_2_ = brand._reader._38_2_;
    brand._reader._40_8_ = RVar1._reader._40_8_;
    iStack_160 = brand._reader.nestingLimit;
    uStack_15c = brand._reader._44_4_;
    kj::Maybe<capnp::InterfaceSchema::Method>::Maybe(&local_1d0,&method);
    RVar1._reader.capTable = pCStack_180;
    RVar1._reader.segment = local_188;
    RVar1._reader.data = local_178;
    RVar1._reader.pointers = pWStack_170;
    RVar1._reader.dataSize = (StructDataBitCount)local_168;
    RVar1._reader.pointerCount = local_168._4_2_;
    RVar1._reader._38_2_ = local_168._6_2_;
    RVar1._reader.nestingLimit = iStack_160;
    RVar1._reader._44_4_ = uStack_15c;
    nodeName(__return_storage_ptr__,this,local_150,local_158,RVar1,&local_1d0);
    kj::Maybe<capnp::InterfaceSchema::Method>::~Maybe(&local_1d0);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::StringTree genParamList(InterfaceSchema interface, StructSchema schema,
                              schema::Brand::Reader brand, InterfaceSchema::Method method) {
    if (schema.getProto().getScopeId() == 0) {
      // A named parameter list.
      return kj::strTree("(", kj::StringTree(
          KJ_MAP(field, schema.getFields()) {
            auto proto = field.getProto();
            auto slot = proto.getSlot();

            return kj::strTree(
                proto.getName(), " :", genType(slot.getType(), interface, nullptr),
                isEmptyValue(slot.getDefaultValue()) ? kj::strTree("") :
                    kj::strTree(" = ", genValue(field.getType(), slot.getDefaultValue())),
                genAnnotations(proto.getAnnotations(), interface));
          }, ", "), ")");
    } else {
      return nodeName(schema, interface, brand, method);
    }
  }